

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O3

void __thiscall interface::interface(interface *this,string *config_text)

{
  string *__rhs;
  ulong uVar1;
  ulong uVar2;
  invalid_argument *piVar3;
  long *plVar4;
  size_type *psVar5;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->baud_rate_ = 0x2648;
  this->parity_ = none;
  this->stop_bits_ = one;
  this->character_size_ = 8;
  local_58 = &(this->device_).field_2;
  (this->device_)._M_dataplus._M_p = (pointer)local_58;
  (this->device_)._M_string_length = 0;
  (this->device_).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->alias_).field_2;
  (this->alias_)._M_dataplus._M_p = (pointer)local_60;
  (this->alias_)._M_string_length = 0;
  (this->alias_).field_2._M_local_buf[0] = '\0';
  uVar1 = std::__cxx11::string::find_first_not_of((char *)config_text,0x14b648,0);
  if (uVar1 == 0xffffffffffffffff) {
    uVar1 = config_text->_M_string_length;
  }
  __rhs = &this->device_;
  uVar2 = std::__cxx11::string::find((char)config_text,0x3a);
  if (uVar2 == 0xffffffffffffffff) {
    uVar2 = config_text->_M_string_length;
  }
  if ((uVar1 != config_text->_M_string_length) && (uVar2 - uVar1 != 0)) {
    std::__cxx11::string::string((string *)&local_80,(string *)config_text,uVar1,uVar2 - uVar1);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->alias_);
    if ((this->device_)._M_dataplus._M_p[(this->device_)._M_string_length - 1] == ')') {
      uVar1 = std::__cxx11::string::find((char)__rhs,0x28);
      if (uVar1 == 0xffffffffffffffff) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,"alias begin not found: \"",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_80._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_80._M_dataplus._M_p == psVar5) {
          local_80.field_2._M_allocated_capacity = *psVar5;
          local_80.field_2._8_8_ = plVar4[3];
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar5;
        }
        local_80._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_80);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::string::string
                ((string *)&local_80,(string *)__rhs,uVar1 + 1,
                 ((this->device_)._M_string_length - uVar1) - 2);
      std::__cxx11::string::operator=((string *)&this->alias_,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      std::__cxx11::string::string((string *)&local_80,(string *)__rhs,0,uVar1);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
    uVar1 = config_text->_M_string_length - uVar2;
    if (uVar1 != 0) {
      std::__cxx11::string::string((string *)&local_80,(string *)config_text,uVar2 + 1,uVar1);
      parse_communication_parameters(this,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
    }
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"device name required.");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

interface::interface( const std::string& config_text )
    : baud_rate_( 9800 )
{
    auto pos = config_text.find_first_not_of( " \t\n" );

    if ( pos == std::string::npos )
        pos = config_text.size();

    auto end = config_text.find( ':', pos );

    if ( end == std::string::npos )
        end = config_text.size();

    if ( pos == config_text.size() || pos == end )
        throw std::invalid_argument( "device name required." );

    device_ = std::string( config_text, pos, end - pos );
    alias_  = device_;

    if ( device_.back() == ')' )
    {
        auto alias_pos = device_.find( '(' );
        if ( alias_pos == std::string::npos )
            throw std::invalid_argument( "alias begin not found: \"" + device_ + "\"" );

        alias_  = std::string( device_, alias_pos + 1, device_.size() - 2 - alias_pos );
        device_ = std::string( device_, 0, alias_pos );
    }

    if ( end != config_text.size() )
        parse_communication_parameters( std::string( config_text, end +1, config_text.size() - end ) );
}